

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

CURLcode file_do(connectdata *conn,_Bool *done)

{
  SessionHandle *pSVar1;
  SessionHandle *pSVar2;
  undefined8 *puVar3;
  _Bool _Var4;
  int iVar5;
  CURLcode CVar6;
  int iVar7;
  char *pcVar8;
  size_t sVar9;
  long lVar10;
  ushort **ppuVar11;
  __off64_t _Var12;
  size_t sVar13;
  long lVar14;
  size_t sVar15;
  undefined8 uVar16;
  SessionHandle *data;
  byte bVar17;
  char *pcVar18;
  curl_off_t __offset;
  size_t __n;
  long lVar19;
  __off_t size;
  timeval tVar20;
  long local_128;
  tm buffer;
  char *ptr2;
  stat statbuf;
  
  pSVar1 = conn->data;
  tVar20 = curlx_tvnow();
  *done = true;
  Curl_initinfo(pSVar1);
  Curl_pgrsStartNow(pSVar1);
  pSVar2 = conn->data;
  puVar3 = (undefined8 *)(pSVar2->req).protop;
  if ((pSVar1->set).upload != true) {
    iVar5 = *(int *)(puVar3 + 2);
    iVar7 = fstat64(iVar5,(stat64 *)&statbuf);
    size = statbuf.st_size;
    if (iVar7 == -1) {
      size = 0;
    }
    else {
      (pSVar1->info).filetime = statbuf.st_mtim.tv_sec;
      if ((((pSVar1->state).range == (char *)0x0) &&
          ((pSVar1->set).timecondition != CURL_TIMECOND_NONE)) &&
         (_Var4 = Curl_meets_timecondition(pSVar1,statbuf.st_mtim.tv_sec), !_Var4)) {
        *done = true;
        return CURLE_OK;
      }
    }
    pcVar18 = (pSVar1->state).buffer;
    if ((((pSVar1->set).opt_no_body == true) && (iVar7 != -1)) &&
       ((pSVar1->set).include_header != false)) {
      curl_msnprintf(pcVar18,0x4001,"Content-Length: %ld\r\n");
      CVar6 = Curl_client_write(conn,3,pcVar18,0);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      CVar6 = Curl_client_write(conn,3,"Accept-ranges: bytes\r\n",0);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      CVar6 = Curl_gmtime(statbuf.st_mtim.tv_sec,&buffer);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      iVar5 = 6;
      if (buffer.tm_wday != 0) {
        iVar5 = buffer.tm_wday + -1;
      }
      curl_msnprintf(pcVar18,0x3fff,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                     Curl_wkday[iVar5],(ulong)(uint)buffer.tm_mday,Curl_month[buffer.tm_mon],
                     (ulong)(buffer.tm_year + 0x76c),(ulong)(uint)buffer.tm_hour,
                     (ulong)buffer._0_8_ >> 0x20,buffer._0_8_ & 0xffffffff);
      CVar6 = Curl_client_write(conn,3,pcVar18,0);
      Curl_pgrsSetDownloadSize(pSVar1,size);
      return CVar6;
    }
    pSVar2 = conn->data;
    lVar19 = -1;
    lVar10 = 0x88;
    if (((pSVar2->state).use_range == true) &&
       (pcVar8 = (pSVar2->state).range, pcVar8 != (char *)0x0)) {
      lVar19 = strtol(pcVar8,(char **)&buffer,0);
      bVar17 = *(byte *)buffer._0_8_;
      pcVar8 = (char *)buffer._0_8_;
      if (bVar17 != 0) {
        ppuVar11 = __ctype_b_loc();
        do {
          if ((bVar17 != 0x2d) && (((*ppuVar11)[bVar17] & 0x2000) == 0)) break;
          bVar17 = pcVar8[1];
          pcVar8 = pcVar8 + 1;
        } while (bVar17 != 0);
      }
      buffer._0_8_ = pcVar8;
      lVar10 = strtol(pcVar8,&ptr2,0);
      lVar14 = -1;
      if (pcVar8 != ptr2) {
        lVar14 = lVar10;
      }
      lVar10 = 0x8a50;
      if (lVar14 != -1 || lVar19 < 0) {
        lVar14 = (lVar14 - lVar19) + 1;
        if (lVar19 < 0) {
          lVar14 = -lVar19;
        }
        (pSVar2->req).maxdownload = lVar14;
      }
    }
    *(long *)((long)pSVar2->sockets + lVar10 + -0x38) = lVar19;
    __offset = (pSVar1->state).resume_from;
    if (__offset < 0) {
      if (iVar7 == -1) {
        Curl_failf(pSVar1,"Can\'t get the size of file.");
        return CURLE_READ_ERROR;
      }
      __offset = __offset + statbuf.st_size;
      (pSVar1->state).resume_from = __offset;
    }
    if (size < __offset) {
      Curl_failf(pSVar1,"failed to resume file:// transfer");
      return CURLE_BAD_DOWNLOAD_RESUME;
    }
    lVar19 = (pSVar1->req).maxdownload;
    lVar10 = size - __offset;
    if (0 < lVar19) {
      lVar10 = lVar19;
    }
    if ((iVar7 != -1) && (lVar10 == 0)) {
      return CURLE_OK;
    }
    if (iVar7 != -1) {
      Curl_pgrsSetDownloadSize(pSVar1,lVar10);
      __offset = (pSVar1->state).resume_from;
    }
    if ((__offset != 0) && (_Var12 = lseek64(iVar5,__offset,0), __offset != _Var12)) {
      return CURLE_BAD_DOWNLOAD_RESUME;
    }
    Curl_pgrsTime(pSVar1,TIMER_STARTTRANSFER);
    local_128 = 0;
    while( true ) {
      sVar15 = 0x3fff;
      if (lVar10 < 0x3fff) {
        sVar15 = curlx_sotouz(lVar10);
      }
      sVar15 = read(iVar5,pcVar18,sVar15);
      CVar6 = CURLE_OK;
      if (((long)sVar15 < 1) || (pcVar18[sVar15] = '\0', CVar6 = CURLE_OK, lVar10 == 0))
      goto LAB_004a2690;
      CVar6 = Curl_client_write(conn,1,pcVar18,sVar15);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      local_128 = local_128 + sVar15;
      Curl_pgrsSetDownloadCounter(pSVar1,local_128);
      iVar7 = Curl_pgrsUpdate(conn);
      if (iVar7 != 0) break;
      lVar10 = lVar10 - sVar15;
      CVar6 = Curl_speedcheck(pSVar1,tVar20);
      if (CVar6 != CURLE_OK) {
LAB_004a2690:
        iVar5 = Curl_pgrsUpdate(conn);
        if (iVar5 != 0) {
          return CURLE_ABORTED_BY_CALLBACK;
        }
        return CVar6;
      }
    }
    CVar6 = CURLE_ABORTED_BY_CALLBACK;
    goto LAB_004a2690;
  }
  pcVar8 = strchr((char *)*puVar3,0x2f);
  pcVar18 = (pSVar2->state).buffer;
  tVar20 = curlx_tvnow();
  pSVar1 = conn->data;
  (pSVar1->req).upload_fromhere = pcVar18;
  if (pcVar8 == (char *)0x0) {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  if (pcVar8[1] == '\0') {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  iVar5 = open64((char *)*puVar3,(uint)((pSVar2->state).resume_from != 0) * 0x200 + 0x241,
                 (pSVar1->set).new_file_perms);
  if (iVar5 < 0) {
    uVar16 = *puVar3;
    pcVar18 = "Can\'t open %s for writing";
LAB_004a2638:
    Curl_failf(pSVar2,pcVar18,uVar16);
    CVar6 = CURLE_WRITE_ERROR;
  }
  else {
    lVar19 = (pSVar2->state).infilesize;
    if (lVar19 != -1) {
      Curl_pgrsSetUploadSize(pSVar2,lVar19);
    }
    if ((pSVar2->state).resume_from < 0) {
      iVar7 = fstat64(iVar5,(stat64 *)&statbuf);
      if (iVar7 != 0) {
        close(iVar5);
        uVar16 = *puVar3;
        pcVar18 = "Can\'t get the size of %s";
        goto LAB_004a2638;
      }
      (pSVar2->state).resume_from = statbuf.st_size;
    }
    lVar19 = 0;
    while (CVar6 = Curl_fillreadbuffer(conn,0x4000,&buffer.tm_sec), CVar6 == CURLE_OK) {
      __n = (size_t)buffer.tm_sec;
      if ((long)__n < 1) {
        iVar7 = Curl_pgrsUpdate(conn);
        CVar6 = CURLE_ABORTED_BY_CALLBACK;
        if (iVar7 == 0) {
          CVar6 = CURLE_OK;
        }
        break;
      }
      lVar10 = (pSVar2->state).resume_from;
      pcVar8 = pcVar18;
      if (lVar10 != 0) {
        lVar14 = 0;
        if (lVar10 < (long)__n) {
          lVar14 = lVar10;
        }
        sVar13 = -(lVar10 - __n);
        sVar9 = 0;
        if ((long)__n <= lVar10) {
          sVar13 = 0;
          sVar9 = lVar10 - __n;
        }
        (pSVar2->state).resume_from = sVar9;
        pcVar8 = pcVar18 + lVar14;
        __n = sVar13;
      }
      sVar9 = write(iVar5,pcVar8,__n);
      if (sVar9 != __n) {
        CVar6 = CURLE_SEND_ERROR;
        break;
      }
      lVar19 = lVar19 + __n;
      Curl_pgrsSetUploadCounter(pSVar2,lVar19);
      iVar7 = Curl_pgrsUpdate(conn);
      if (iVar7 != 0) {
        CVar6 = CURLE_ABORTED_BY_CALLBACK;
        break;
      }
      CVar6 = Curl_speedcheck(pSVar2,tVar20);
      if (CVar6 != CURLE_OK) break;
    }
    close(iVar5);
  }
  return CVar6;
}

Assistant:

static CURLcode file_do(struct connectdata *conn, bool *done)
{
  /* This implementation ignores the host name in conformance with
     RFC 1738. Only local files (reachable via the standard file system)
     are supported. This means that files on remotely mounted directories
     (via NFS, Samba, NT sharing) can be accessed through a file:// URL
  */
  CURLcode result = CURLE_OK;
  struct_stat statbuf; /* struct_stat instead of struct stat just to allow the
                          Windows version to have a different struct without
                          having to redefine the simple word 'stat' */
  curl_off_t expected_size=0;
  bool fstated=FALSE;
  ssize_t nread;
  struct SessionHandle *data = conn->data;
  char *buf = data->state.buffer;
  curl_off_t bytecount = 0;
  int fd;
  struct timeval now = Curl_tvnow();
  struct FILEPROTO *file;

  *done = TRUE; /* unconditionally */

  Curl_initinfo(data);
  Curl_pgrsStartNow(data);

  if(data->set.upload)
    return file_upload(conn);

  file = conn->data->req.protop;

  /* get the fd from the connection phase */
  fd = file->fd;

  /* VMS: This only works reliable for STREAMLF files */
  if(-1 != fstat(fd, &statbuf)) {
    /* we could stat it, then read out the size */
    expected_size = statbuf.st_size;
    /* and store the modification time */
    data->info.filetime = (long)statbuf.st_mtime;
    fstated = TRUE;
  }

  if(fstated && !data->state.range && data->set.timecondition) {
    if(!Curl_meets_timecondition(data, (time_t)data->info.filetime)) {
      *done = TRUE;
      return CURLE_OK;
    }
  }

  /* If we have selected NOBODY and HEADER, it means that we only want file
     information. Which for FILE can't be much more than the file size and
     date. */
  if(data->set.opt_no_body && data->set.include_header && fstated) {
    snprintf(buf, sizeof(data->state.buffer),
             "Content-Length: %" CURL_FORMAT_CURL_OFF_T "\r\n", expected_size);
    result = Curl_client_write(conn, CLIENTWRITE_BOTH, buf, 0);
    if(result)
      return result;

    result = Curl_client_write(conn, CLIENTWRITE_BOTH,
                               (char *)"Accept-ranges: bytes\r\n", 0);
    if(result)
      return result;

    if(fstated) {
      time_t filetime = (time_t)statbuf.st_mtime;
      struct tm buffer;
      const struct tm *tm = &buffer;
      result = Curl_gmtime(filetime, &buffer);
      if(result)
        return result;

      /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
      snprintf(buf, BUFSIZE-1,
               "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
               Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
               tm->tm_mday,
               Curl_month[tm->tm_mon],
               tm->tm_year + 1900,
               tm->tm_hour,
               tm->tm_min,
               tm->tm_sec);
      result = Curl_client_write(conn, CLIENTWRITE_BOTH, buf, 0);
    }
    /* if we fstat()ed the file, set the file size to make it available post-
       transfer */
    if(fstated)
      Curl_pgrsSetDownloadSize(data, expected_size);
    return result;
  }

  /* Check whether file range has been specified */
  file_range(conn);

  /* Adjust the start offset in case we want to get the N last bytes
   * of the stream iff the filesize could be determined */
  if(data->state.resume_from < 0) {
    if(!fstated) {
      failf(data, "Can't get the size of file.");
      return CURLE_READ_ERROR;
    }
    else
      data->state.resume_from += (curl_off_t)statbuf.st_size;
  }

  if(data->state.resume_from <= expected_size)
    expected_size -= data->state.resume_from;
  else {
    failf(data, "failed to resume file:// transfer");
    return CURLE_BAD_DOWNLOAD_RESUME;
  }

  /* A high water mark has been specified so we obey... */
  if(data->req.maxdownload > 0)
    expected_size = data->req.maxdownload;

  if(fstated && (expected_size == 0))
    return CURLE_OK;

  /* The following is a shortcut implementation of file reading
     this is both more efficient than the former call to download() and
     it avoids problems with select() and recv() on file descriptors
     in Winsock */
  if(fstated)
    Curl_pgrsSetDownloadSize(data, expected_size);

  if(data->state.resume_from) {
    if(data->state.resume_from !=
       lseek(fd, data->state.resume_from, SEEK_SET))
      return CURLE_BAD_DOWNLOAD_RESUME;
  }

  Curl_pgrsTime(data, TIMER_STARTTRANSFER);

  while(!result) {
    /* Don't fill a whole buffer if we want less than all data */
    size_t bytestoread =
      (expected_size < CURL_OFF_T_C(BUFSIZE) - CURL_OFF_T_C(1)) ?
      curlx_sotouz(expected_size) : BUFSIZE - 1;

    nread = read(fd, buf, bytestoread);

    if(nread > 0)
      buf[nread] = 0;

    if(nread <= 0 || expected_size == 0)
      break;

    bytecount += nread;
    expected_size -= nread;

    result = Curl_client_write(conn, CLIENTWRITE_BODY, buf, nread);
    if(result)
      return result;

    Curl_pgrsSetDownloadCounter(data, bytecount);

    if(Curl_pgrsUpdate(conn))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, now);
  }
  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;

  return result;
}